

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O3

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  mbedtls_ct_condition_t mVar6;
  ulong uVar7;
  
  uVar7 = 0;
  mVar6 = 0;
  if (limbs != 0) {
    do {
      lVar2 = limbs - 1;
      uVar5 = A[limbs - 1];
      uVar4 = B[lVar2] ^ uVar5;
      lVar3 = limbs - 1;
      uVar1 = B[limbs - 1];
      limbs = limbs - 1;
      uVar7 = (long)(B[lVar2] - uVar5 & ~uVar4 | uVar5 & uVar4) >> 0x3f | uVar7;
      uVar5 = A[lVar3] ^ uVar1;
      uVar5 = (long)(A[lVar3] - uVar1 & ~uVar5 | uVar1 & uVar5) >> 0x3f;
      mVar6 = mVar6 | ~uVar7 & uVar5;
      uVar7 = uVar7 | uVar5;
    } while (limbs != 0);
  }
  return mVar6;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_lt_ct(const mbedtls_mpi_uint *A,
                                              const mbedtls_mpi_uint *B,
                                              size_t limbs)
{
    mbedtls_ct_condition_t ret = MBEDTLS_CT_FALSE, cond = MBEDTLS_CT_FALSE, done = MBEDTLS_CT_FALSE;

    for (size_t i = limbs; i > 0; i--) {
        /*
         * If B[i - 1] < A[i - 1] then A < B is false and the result must
         * remain 0.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(B[i - 1], A[i - 1]);
        done = mbedtls_ct_bool_or(done, cond);

        /*
         * If A[i - 1] < B[i - 1] then A < B is true.
         *
         * Again even if we can make a decision, we just mark the result and
         * the fact that we are done and continue looping.
         */
        cond = mbedtls_ct_uint_lt(A[i - 1], B[i - 1]);
        ret  = mbedtls_ct_bool_or(ret, mbedtls_ct_bool_and(cond, mbedtls_ct_bool_not(done)));
        done = mbedtls_ct_bool_or(done, cond);
    }

    /*
     * If all the limbs were equal, then the numbers are equal, A < B is false
     * and leaving the result 0 is correct.
     */

    return ret;
}